

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O1

void Cba_ObjSetAttrs(Cba_Ntk_t *p,int i,int *a,int s)

{
  int iVar1;
  ulong uVar2;
  
  if (i < 0) {
    __assert_fail("i>=0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                  ,0xf2,"int Cba_ObjAttr(Cba_Ntk_t *, int)");
  }
  if (0 < (p->vObjAttr).nSize) {
    Vec_IntFillExtra(&p->vObjAttr,i + 1,0);
    if ((p->vObjAttr).nSize <= i) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if ((p->vObjAttr).pArray[(uint)i] != 0) {
      __assert_fail("Cba_ObjAttr(p, i) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                    ,0xfa,"void Cba_ObjSetAttrs(Cba_Ntk_t *, int, int *, int)");
    }
  }
  if (a != (int *)0x0) {
    iVar1 = (p->vAttrSto).nSize;
    Vec_IntFillExtra(&p->vObjAttr,i + 1,0);
    if ((p->vObjAttr).nSize <= i) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (p->vObjAttr).pArray[(uint)i] = iVar1;
    Vec_IntPush(&p->vAttrSto,s);
    if (0 < s) {
      uVar2 = 0;
      do {
        Vec_IntPush(&p->vAttrSto,a[uVar2]);
        uVar2 = uVar2 + 1;
      } while ((uint)s != uVar2);
    }
  }
  return;
}

Assistant:

static inline void           Cba_ObjSetAttrs( Cba_Ntk_t * p, int i, int * a, int s )  { assert(Cba_ObjAttr(p, i) == 0); if ( !a ) return; Vec_IntSetEntry(&p->vObjAttr, i, Vec_IntSize(&p->vAttrSto)); Vec_IntPush(&p->vAttrSto, s); Vec_IntPushArray(&p->vAttrSto, a, s);  }